

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rendering.cpp
# Opt level: O2

void duckdb::OpenBracket(vector<unsigned_long,_true> *brackets,
                        vector<unsigned_long,_true> *cursor_brackets,idx_t pos,idx_t i)

{
  pointer puVar1;
  idx_t local_20;
  
  local_20 = i;
  if (pos == i) {
    puVar1 = (cursor_brackets->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (puVar1 != (cursor_brackets->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      (cursor_brackets->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar1;
    }
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)cursor_brackets,&local_20);
  }
  if (((cursor_brackets->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start ==
       (cursor_brackets->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish) && (pos + 1 == local_20 || local_20 + 1 == pos)) {
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)cursor_brackets,&local_20);
  }
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)brackets,&local_20);
  return;
}

Assistant:

static void OpenBracket(vector<idx_t> &brackets, vector<idx_t> &cursor_brackets, idx_t pos, idx_t i) {
	// check if the cursor is at this position
	if (pos == i) {
		// cursor is exactly on this position - always highlight this bracket
		if (!cursor_brackets.empty()) {
			cursor_brackets.clear();
		}
		cursor_brackets.push_back(i);
	}
	if (cursor_brackets.empty() && ((i + 1) == pos || (pos + 1) == i)) {
		// cursor is either BEFORE or AFTER this bracket and we don't have any highlighted bracket yet
		// highlight this bracket
		cursor_brackets.push_back(i);
	}
	brackets.push_back(i);
}